

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O2

string * __thiscall
cmTimestamp::CurrentTime
          (string *__return_storage_ptr__,cmTimestamp *this,string *formatString,bool utcFlag)

{
  time_t timeT;
  allocator<char> local_211;
  time_t currentTimeT;
  string source_date_epoch;
  string local_1e8;
  string local_1c8;
  istringstream iss;
  uint auStack_188 [88];
  
  timeT = time((time_t *)0x0);
  source_date_epoch._M_dataplus._M_p = (pointer)&source_date_epoch.field_2;
  source_date_epoch._M_string_length = 0;
  source_date_epoch.field_2._M_local_buf[0] = '\0';
  currentTimeT = timeT;
  cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",&source_date_epoch);
  if (source_date_epoch._M_string_length != 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&iss,(string *)&source_date_epoch,_S_in);
    std::istream::_M_extract<long>((long *)&iss);
    if ((*(uint *)((long)auStack_188 + *(long *)(_iss + -0x18)) & 7) != 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"Cannot parse SOURCE_DATE_EPOCH as integer",&local_211);
      cmSystemTools::Error(&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      exit(0x1b);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    timeT = currentTimeT;
  }
  if (timeT == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&local_1e8,(string *)formatString);
    CreateTimestampFromTimeT(__return_storage_ptr__,this,timeT,&local_1e8,utcFlag);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  std::__cxx11::string::~string((string *)&source_date_epoch);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CurrentTime(const std::string& formatString,
                                     bool utcFlag)
{
  time_t currentTimeT = time(nullptr);
  std::string source_date_epoch;
  cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
  if (!source_date_epoch.empty()) {
    std::istringstream iss(source_date_epoch);
    iss >> currentTimeT;
    if (iss.fail() || !iss.eof()) {
      cmSystemTools::Error("Cannot parse SOURCE_DATE_EPOCH as integer");
      exit(27);
    }
  }
  if (currentTimeT == time_t(-1)) {
    return std::string();
  }

  return CreateTimestampFromTimeT(currentTimeT, formatString, utcFlag);
}